

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_description-c.cpp
# Opt level: O1

duckdb_state GetTableDescription(TableDescriptionWrapper *wrapper,idx_t index)

{
  duckdb_state dVar1;
  pointer pTVar2;
  ulong uVar3;
  unsigned_long in_R8;
  Exception local_60;
  undefined1 local_50 [16];
  string local_40;
  
  dVar1 = DuckDBError;
  if (wrapper != (TableDescriptionWrapper *)0x0) {
    pTVar2 = duckdb::
             unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
             ::operator->(&wrapper->description);
    uVar3 = ((long)(pTVar2->columns).
                   super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   .
                   super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pTVar2->columns).
                   super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   .
                   super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
    dVar1 = DuckDBSuccess;
    if (uVar3 < index || uVar3 - index == 0) {
      local_60._0_8_ = local_50;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Column index %d is out of range, table only has %d columns",""
                );
      pTVar2 = duckdb::
               unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
               ::operator->(&wrapper->description);
      duckdb::Exception::ConstructMessage<unsigned_long,unsigned_long>
                (&local_40,&local_60,(string *)index,
                 ((long)(pTVar2->columns).
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        .
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pTVar2->columns).
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        .
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed,in_R8)
      ;
      std::__cxx11::string::operator=((string *)&wrapper->error,(string *)&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      if ((undefined1 *)local_60._0_8_ != local_50) {
        operator_delete((void *)local_60._0_8_);
      }
      dVar1 = DuckDBError;
    }
  }
  return dVar1;
}

Assistant:

duckdb_state GetTableDescription(TableDescriptionWrapper *wrapper, idx_t index) {
	if (!wrapper) {
		return DuckDBError;
	}
	auto &table = wrapper->description;
	if (index >= table->columns.size()) {
		wrapper->error = duckdb::StringUtil::Format("Column index %d is out of range, table only has %d columns", index,
		                                            table->columns.size());
		return DuckDBError;
	}
	return DuckDBSuccess;
}